

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  int iVar1;
  Decoration *pDVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  runtime_error *prVar8;
  mapped_type *pmVar9;
  SPIRType *pSVar10;
  BufferPackingStandard extraout_EDX;
  uint uVar11;
  CompilerGLSL *pCVar12;
  uint uVar13;
  ulong uVar14;
  Bitset member_flags;
  undefined1 local_a0 [8];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_98;
  CompilerGLSL *local_60;
  SPIRType *local_58;
  ID *local_50;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  ulong local_40;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_38;
  
  bVar3 = Compiler::type_is_top_level_physical_pointer(&this->super_Compiler,type);
  if (bVar3) {
    if (type->pointer == false) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_a0 = (undefined1  [8])(local_a0 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Types in PhysicalStorageBufferEXT must be pointers.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)local_a0);
      *(undefined ***)prVar8 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
      return 8;
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_a0 = (undefined1  [8])(local_a0 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,
               "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
               ,"");
    ::std::runtime_error::runtime_error(prVar8,(string *)local_a0);
    *(undefined ***)prVar8 = &PTR__runtime_error_003f8e68;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar12 = this;
  bVar3 = Compiler::type_is_top_level_array(&this->super_Compiler,type);
  if (bVar3) {
    uVar4 = to_array_size_literal
                      (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
    uVar5 = type_to_packed_array_stride(this,type,flags,packing);
    uVar5 = uVar5 * uVar4;
    if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) {
      return uVar5;
    }
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      return uVar5;
    }
    uVar13 = type->width;
    uVar11 = type->vecsize;
    goto LAB_001df885;
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    if ((type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size != 0) {
      local_48 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
      local_50 = &(type->super_IVariant).self;
      uVar11 = 1;
      uVar14 = 0;
      local_40 = 0;
      uVar4 = 1;
      local_60 = this;
      local_58 = type;
      do {
        pSVar10 = local_58;
        pCVar12 = local_60;
        pmVar9 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_48,local_50);
        pDVar2 = (pmVar9->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
        local_a0 = (undefined1  [8])pDVar2[uVar14].decoration_flags.lower;
        local_38._M_h = (__hashtable_alloc *)(local_a0 + 8);
        local_98._M_buckets = (__buckets_ptr)0x0;
        local_98._M_bucket_count = pDVar2[uVar14].decoration_flags.higher._M_h._M_bucket_count;
        local_98._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_98._M_element_count = pDVar2[uVar14].decoration_flags.higher._M_h._M_element_count;
        local_98._M_rehash_policy._M_max_load_factor =
             pDVar2[uVar14].decoration_flags.higher._M_h._M_rehash_policy._M_max_load_factor;
        local_98._M_rehash_policy._4_4_ =
             *(undefined4 *)&pDVar2[uVar14].decoration_flags.higher._M_h._M_rehash_policy.field_0x4;
        local_98._M_rehash_policy._M_next_resize =
             pDVar2[uVar14].decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
        local_98._M_single_bucket = (__node_base_ptr)0x0;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_38._M_h,&pDVar2[uVar14].decoration_flags.higher._M_h,&local_38);
        pSVar10 = Variant::get<spirv_cross::SPIRType>
                            ((pCVar12->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>
                             .ptr + (pSVar10->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    ptr[uVar14].id);
        uVar6 = type_to_packed_alignment(pCVar12,pSVar10,(Bitset *)local_a0,packing);
        iVar1 = *(int *)&(pSVar10->super_IVariant).field_0xc;
        uVar7 = type_to_packed_size(pCVar12,pSVar10,(Bitset *)local_a0,packing);
        uVar5 = 1;
        if (iVar1 == 0xf) {
          uVar5 = uVar6;
        }
        if (uVar4 < uVar6) {
          uVar4 = uVar6;
        }
        uVar13 = uVar7 + (-uVar4 & ((int)local_40 + uVar4) - 1);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_a0 + 8));
        uVar14 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        local_40 = (ulong)uVar13;
        uVar4 = uVar5;
      } while (uVar14 < (local_58->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size);
      return uVar13;
    }
    return 0;
  }
  uVar4 = type_to_packed_base_size(pCVar12,type,extraout_EDX);
  if ((packing & ~BufferPackingStd430) == BufferPackingScalar) {
    return uVar4 * type->vecsize * type->columns;
  }
  uVar11 = type->vecsize;
  uVar13 = type->columns;
  uVar6 = uVar11 * uVar4;
  uVar5 = 0;
  if (uVar13 == 1) {
    uVar5 = uVar6;
  }
  uVar14 = flags->lower;
  if ((1 < uVar13 & (byte)((uVar14 & 0xffffffff) >> 5) & 7) == 1) {
    if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
      uVar5 = uVar4 * uVar13 * 4;
      goto LAB_001dfa80;
    }
    if (uVar11 != 3) {
      uVar5 = uVar6 * uVar13;
      goto LAB_001dfa80;
    }
    if ((uVar14 & 0x10) != 0) goto LAB_001dfa8f;
    uVar5 = uVar4 * uVar13 * 4;
  }
  else {
LAB_001dfa80:
    if (((byte)uVar14 >> 4 & 1 < uVar11) != 0) {
LAB_001dfa8f:
      if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
         (uVar13 == 3)) {
        uVar5 = uVar6 * 4;
      }
      else {
        uVar5 = uVar6 * uVar13;
      }
    }
  }
  if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar13 < 2) {
    return uVar5;
  }
  uVar13 = type->width;
LAB_001df885:
  return uVar5 + (uVar13 >> 3) * (uVar11 - 4);
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type_is_top_level_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (type_is_top_level_array(type))
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}